

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>::find<kj::StringPtr,char_const(&)[4]>
          (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this,ArrayPtr<kj::StringPtr> table
          ,char (*params) [7])

{
  int iVar1;
  char *pcVar2;
  StringHasher *this_00;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  size_t extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar9;
  uint uVar10;
  StringPtr *pSVar12;
  size_t in_R8;
  Maybe<unsigned_long> MVar13;
  StringPtr str;
  StringPtr a;
  StringPtr b;
  ulong uVar11;
  
  aVar8.value = table.size_;
  pSVar12 = table.ptr;
  aVar9.value = aVar8.value;
  if (pSVar12[1].content.size_ != 0) {
    sVar6 = strlen(*params);
    str.content.size_ = extraout_RDX;
    str.content.ptr = (char *)(sVar6 + 1);
    uVar5 = _::anon_unknown_0::StringHasher::hashCode((StringHasher *)params,str);
    aVar9 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pSVar12[1].content.size_;
    uVar10 = (int)aVar9.value - 1U & uVar5;
    while( true ) {
      uVar11 = (ulong)uVar10;
      pcVar2 = pSVar12[1].content.ptr;
      iVar1 = *(int *)(pcVar2 + uVar11 * 8 + 4);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(uint *)(pcVar2 + uVar11 * 8) == uVar5)) {
        lVar7 = (ulong)(iVar1 - 2) * 0x10;
        this_00 = *(StringHasher **)(aVar8.value + lVar7);
        pcVar3 = *(char **)(aVar8.value + 8 + lVar7);
        sVar6 = strlen(*params);
        a.content.size_ = (size_t)params;
        a.content.ptr = pcVar3;
        b.content.size_ = in_R8;
        b.content.ptr = (char *)(sVar6 + 1);
        bVar4 = _::anon_unknown_0::StringHasher::matches(this_00,a,b);
        if (bVar4) {
          iVar1 = *(int *)(pcVar2 + uVar11 * 8 + 4);
          *(undefined1 *)this = 1;
          this->erasedCount = (ulong)(iVar1 - 2);
          aVar9 = extraout_RDX_00;
          goto LAB_0014e839;
        }
        aVar9 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pSVar12[1].content.size_
        ;
      }
      uVar10 = (uint)(uVar11 + 1);
      if (uVar11 + 1 == aVar9.value) {
        uVar10 = 0;
      }
    }
  }
  *(undefined1 *)this = 0;
LAB_0014e839:
  MVar13.ptr.field_1.value = aVar9.value;
  MVar13.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar13.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }